

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O1

int process_marker(jpeg *z,int m)

{
  uint8 **ppuVar1;
  FILE *__stream;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  bool bVar9;
  int sizes [16];
  int local_78 [18];
  
  if (m < 0xdb) {
    if (m == 0xc2) {
      failure_reason = "JPEG format not supported (progressive)";
    }
    else if (m == 0xc4) {
      iVar3 = get8(&z->s);
      iVar4 = get8(&z->s);
      iVar3 = iVar4 + iVar3 * 0x100 + -2;
      do {
        if (iVar3 < 1) goto LAB_0014ef0f;
        uVar2 = get8(&z->s);
        uVar6 = uVar2 & 0xf;
        if (uVar6 < 4 && (int)uVar2 < 0x20) {
          lVar8 = 0;
          uVar7 = 0;
          do {
            iVar4 = get8(&z->s);
            local_78[lVar8] = iVar4;
            uVar7 = uVar7 + iVar4;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0x10);
          iVar3 = iVar3 + -0x11;
          if (uVar2 < 0x10) {
            iVar4 = build_huffman(z->huff_dc + uVar6,local_78);
            lVar8 = 0x28;
          }
          else {
            iVar4 = build_huffman(z->huff_ac + uVar6,local_78);
            lVar8 = 0x1a68;
          }
          if (iVar4 == 0) goto LAB_0014ee72;
          if (0 < (int)uVar7) {
            uVar5 = 0;
            do {
              iVar4 = get8(&z->s);
              z->huff_dc[uVar6].values[uVar5 + lVar8 + -0x28] = (uint8)iVar4;
              uVar5 = uVar5 + 1;
            } while (uVar7 != uVar5);
          }
          iVar3 = iVar3 - uVar7;
          bVar9 = true;
        }
        else {
          failure_reason = "Corrupt JPEG";
LAB_0014ee72:
          bVar9 = false;
        }
      } while (bVar9);
    }
    else {
LAB_0014ef6d:
      if (m == 0xfe || (m & 0xfffffff0U) == 0xe0) {
        iVar3 = get8(&z->s);
        iVar4 = get8(&z->s);
        iVar3 = iVar4 + iVar3 * 0x100 + -2;
        __stream = (FILE *)(z->s).img_file;
        if (__stream == (FILE *)0x0) {
          ppuVar1 = &(z->s).img_buffer;
          *ppuVar1 = *ppuVar1 + iVar3;
        }
        else {
          fseek(__stream,(long)iVar3,1);
        }
LAB_0014efc2:
        bVar9 = true;
        goto LAB_0014efc4;
      }
    }
  }
  else if (m == 0xdb) {
    iVar3 = get8(&z->s);
    iVar4 = get8(&z->s);
    iVar3 = iVar4 + iVar3 * 0x100 + -2;
    do {
      if (iVar3 < 1) goto LAB_0014ef0f;
      uVar2 = get8(&z->s);
      if ((uVar2 < 0x10) && ((uVar2 & 0xf) < 4)) {
        lVar8 = 0;
        do {
          iVar4 = get8(&z->s);
          z->dequant[0][(ulong)""[lVar8] + (ulong)((uVar2 & 0xf) << 6)] = (uint8)iVar4;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x40);
        iVar3 = iVar3 + -0x41;
        bVar9 = true;
      }
      else {
        failure_reason = "Corrupt JPEG";
        bVar9 = false;
      }
    } while (bVar9);
  }
  else {
    if (m == 0xdd) {
      iVar3 = get8(&z->s);
      iVar4 = get8(&z->s);
      if (iVar4 + iVar3 * 0x100 == 4) {
        iVar3 = get8(&z->s);
        iVar4 = get8(&z->s);
        z->restart_interval = iVar4 + iVar3 * 0x100;
        goto LAB_0014efc2;
      }
    }
    else if (m != 0xff) goto LAB_0014ef6d;
    failure_reason = "Corrupt JPEG";
  }
  bVar9 = false;
LAB_0014efc4:
  return (int)bVar9;
LAB_0014ef0f:
  bVar9 = iVar3 == 0;
  goto LAB_0014efc4;
}

Assistant:

static int process_marker(jpeg *z, int m)
{
   int L;
   switch (m) {
      case MARKER_none: // no marker found
         return e("expected marker","Corrupt JPEG");

      case 0xC2: // SOF - progressive
         return e("progressive jpeg","JPEG format not supported (progressive)");

      case 0xDD: // DRI - specify restart interval
         if (get16(&z->s) != 4) return e("bad DRI len","Corrupt JPEG");
         z->restart_interval = get16(&z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = get16(&z->s)-2;
         while (L > 0) {
            int q = get8(&z->s);
            int p = q >> 4;
            int t = q & 15,i;
            if (p != 0) return e("bad DQT type","Corrupt JPEG");
            if (t > 3) return e("bad DQT table","Corrupt JPEG");
            for (i=0; i < 64; ++i)
               z->dequant[t][dezigzag[i]] = get8u(&z->s);
            #if STBI_SIMD
            for (i=0; i < 64; ++i)
               z->dequant2[t][i] = dequant[t][i];
            #endif
            L -= 65;
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = get16(&z->s)-2;
         while (L > 0) {
            uint8 *v;
            int sizes[16],i,m=0;
            int q = get8(&z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return e("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = get8(&z->s);
               m += sizes[i];
            }
            L -= 17;
            if (tc == 0) {
               if (!build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < m; ++i)
               v[i] = get8u(&z->s);
            L -= m;
         }
         return L==0;
   }
   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      skip(&z->s, get16(&z->s)-2);
      return 1;
   }
   return 0;
}